

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::compute_degree(Graph *this)

{
  reference pvVar1;
  size_type sVar2;
  size_type sVar3;
  reference pvVar4;
  uint local_14;
  vertex_t i;
  Graph *this_local;
  
  for (local_14 = 0; local_14 < this->num_vertices_; local_14 = local_14 + 1) {
    pvVar1 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->succ_,(ulong)local_14);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar1);
    pvVar1 = std::
             vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::at(&this->pred_,(ulong)local_14);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(pvVar1);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                       (&this->deg_,(ulong)local_14);
    *pvVar4 = (int)sVar2 + (int)sVar3;
  }
  return;
}

Assistant:

void Graph::compute_degree() {
    for (vertex_t i = 0; i < num_vertices_; ++i) {
        deg_.at(i) = (degree_t)succ_.at(i).size() + (degree_t)pred_.at(i).size();
    }
}